

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

int __thiscall CTPNSymBase::check_lvalue_resolved(CTPNSymBase *this,CTcPrsSymtab *symtab)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CTcSymbol *pCVar3;
  
  iVar1 = (*(this->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0xc])();
  iVar2 = (*(this->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0xd])(this);
  pCVar3 = CTcPrsSymtab::find(symtab,(textchar_t *)CONCAT44(extraout_var,iVar1),
                              CONCAT44(extraout_var_00,iVar2));
  if (pCVar3 != (CTcSymbol *)0x0) {
    iVar1 = (*(pCVar3->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.
              _vptr_CVmHashEntry[5])(pCVar3);
    return iVar1;
  }
  return 0;
}

Assistant:

int CTPNSymBase::check_lvalue_resolved(class CTcPrsSymtab *symtab) const
{
    CTcSymbol *sym;

    /* look up the symbol in the given scope */
    sym = symtab->find(get_sym_text(), get_sym_text_len());
    if (sym != 0)
    {
        /* ask the symbol what it thinks */
        return sym->check_lvalue();
    }
    else
    {
        /* it's undefined - can't be an lvalue */
        return FALSE;
    }
}